

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::ColorEqual
          (ShaderImageLoadStoreBase *this,vec4 *c0,vec4 *c1,vec4 *epsilon)

{
  float fVar1;
  
  fVar1 = ABS(*(float *)&(this->super_SubcaseBase).super_GLWrapper._vptr_GLWrapper - c0->m_data[0]);
  if (((fVar1 < c1->m_data[0] || fVar1 == c1->m_data[0]) &&
      (fVar1 = ABS(*(float *)((long)&(this->super_SubcaseBase).super_GLWrapper._vptr_GLWrapper + 4)
                   - c0->m_data[1]), fVar1 < c1->m_data[1] || fVar1 == c1->m_data[1])) &&
     (fVar1 = ABS(*(float *)&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper.m_gl -
                  c0->m_data[2]), fVar1 < c1->m_data[2] || fVar1 == c1->m_data[2])) {
    fVar1 = ABS(*(float *)((long)&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper.
                                  m_gl + 4) - c0->m_data[3]);
    return fVar1 < c1->m_data[3] || fVar1 == c1->m_data[3];
  }
  return false;
}

Assistant:

inline bool ColorEqual(const vec4& c0, const vec4& c1, const vec4& epsilon)
	{
		if (fabs(c0[0] - c1[0]) > epsilon[0])
			return false;
		if (fabs(c0[1] - c1[1]) > epsilon[1])
			return false;
		if (fabs(c0[2] - c1[2]) > epsilon[2])
			return false;
		if (fabs(c0[3] - c1[3]) > epsilon[3])
			return false;
		return true;
	}